

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

blargg_err_t __thiscall Snes_Spc::play(Snes_Spc *this,int count,sample_t_conflict1 *out)

{
  blargg_err_t pcVar1;
  undefined8 in_RDX;
  time_t end_time;
  int in_ESI;
  sample_t_conflict1 *in_RDI;
  Snes_Spc *unaff_retaddr;
  char *err;
  undefined4 in_stack_fffffffffffffff0;
  
  end_time = (time_t)((ulong)in_RDX >> 0x20);
  if (in_ESI != 0) {
    set_output(unaff_retaddr,in_RDI,in_ESI);
    end_frame((Snes_Spc *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),end_time);
  }
  pcVar1 = *(blargg_err_t *)(in_RDI + 0x44c);
  in_RDI[0x44c] = 0;
  in_RDI[0x44d] = 0;
  in_RDI[0x44e] = 0;
  in_RDI[0x44f] = 0;
  return pcVar1;
}

Assistant:

blargg_err_t Snes_Spc::play( int count, sample_t* out )
{
	require( (count & 1) == 0 ); // must be even
	if ( count )
	{
		set_output( out, count );
		end_frame( count * (clocks_per_sample / 2) );
	}
	
	const char* err = m.cpu_error;
	m.cpu_error = 0;
	return err;
}